

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O2

int replaceTxa(istream *in,ostream *output,path *replacement)

{
  size_type __last;
  size_type __last_00;
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  size_type __n;
  pointer __result;
  thread *ptVar4;
  size_t sVar5;
  TxaChunk *chunk;
  pointer pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  anon_class_32_4_76e35334_for__M_head_impl *__args;
  anon_class_32_4_76e35334_for__M_head_impl *__args_00;
  thread *thread;
  pointer pcVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  long lVar10;
  size_t i_1;
  long lVar11;
  ulong uVar12;
  bool indexed;
  char local_1a9;
  string replacementName;
  TxaHeader header;
  Compressor compressor;
  path rfilename;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  chunks;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vector<Image,_std::allocator<Image>_> images;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string replacementTemplate;
  atomic<unsigned_long> i;
  path replacementDir;
  
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem((path *)&header,replacement);
  std::filesystem::__cxx11::path::string(&replacementTemplate,(path *)&header);
  std::filesystem::__cxx11::path::~path((path *)&header);
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  pTVar1 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar6 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  Image::Image((Image *)&rfilename,(Size)0x0,(Color)0x0);
  std::vector<Image,_std::allocator<Image>_>::vector
            (&images,((long)pTVar1 - (long)pTVar6) / 0x38,(value_type *)&rfilename,
             (allocator_type *)local_e8);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            ((_Vector_base<Color,_std::allocator<Color>_> *)&rfilename._M_pathname._M_string_length)
  ;
  rfilename._M_pathname._M_dataplus._M_p = (pointer)0x0;
  rfilename._M_pathname._M_string_length = 0;
  rfilename._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&chunks,((long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x38,(value_type *)&rfilename,
           (allocator_type *)local_e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rfilename);
  Compressor::Compressor(&compressor);
  indexed = true;
  lVar10 = 0x18;
  lVar11 = 0;
  for (pcVar7 = (pointer)0x0;
      local_a0._M_dataplus._M_p =
           (pointer)(((long)chunks.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)chunks.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18),
      pcVar7 < local_a0._M_dataplus._M_p; pcVar7 = pcVar7 + 1) {
    std::operator+(&rfilename._M_pathname,&replacementTemplate,"_");
    std::operator+(&replacementName,&rfilename._M_pathname,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                            _M_impl.super__Vector_impl_data._M_start)->index + lVar10));
    std::__cxx11::string::~string((string *)&rfilename);
    std::operator+(&local_a0,&replacementName,".png");
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              ((path *)local_e8,(__cxx11 *)&local_a0,__source);
    std::filesystem::__cxx11::operator/(&rfilename,&replacementDir,(path *)local_e8);
    std::filesystem::__cxx11::path::~path((path *)local_e8);
    std::__cxx11::string::~string((string *)&local_a0);
    Image::readPNG((Image *)local_e8,&rfilename);
    Image::operator=((Image *)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->size).width +
                              lVar11),(Image *)local_e8);
    std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
              ((_Vector_base<Color,_std::allocator<Color>_> *)(local_e8 + 8));
    bVar2 = Compressor::canPalette
                      (&compressor,
                       (Image *)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->size).width +
                                lVar11),false);
    if (!bVar2) {
      fprintf(_stderr,"%s has too many colors to palette, disabling indexed color for all images\n",
              replacementName._M_dataplus._M_p);
      indexed = false;
    }
    std::filesystem::__cxx11::path::~path(&rfilename);
    std::__cxx11::string::~string((string *)&replacementName);
    lVar10 = lVar10 + 0x38;
    lVar11 = lVar11 + 0x20;
  }
  local_e8._0_8_ = &indexed;
  header.indexed = (uint32_t)indexed;
  local_e8._8_8_ = &chunks;
  local_d8._M_allocated_capacity = (size_type)&images;
  local_d8._8_8_ = &header;
  i.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  replacementName._M_dataplus._M_p = (pointer)0x0;
  replacementName._M_string_length = 0;
  replacementName.field_2._M_allocated_capacity = 0;
  for (uVar9 = 0; uVar3 = std::thread::hardware_concurrency(),
      __last = replacementName._M_string_length, _Var8 = replacementName._M_dataplus, uVar9 < uVar3;
      uVar9 = uVar9 + 1) {
    rfilename._M_pathname._M_dataplus._M_p = &local_1a9;
    rfilename._M_pathname.field_2._M_allocated_capacity = (size_type)&local_a0;
    rfilename._M_pathname.field_2._8_8_ = local_e8;
    rfilename._M_pathname._M_string_length = (size_type)&i;
    if (replacementName._M_string_length == replacementName.field_2._M_allocated_capacity) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      ((vector<std::thread,_std::allocator<std::thread>_> *)&replacementName,1,
                       "vector::_M_realloc_insert");
      __last_00 = replacementName._M_string_length;
      _Var8 = replacementName._M_dataplus;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &replacementName,__n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                ((allocator_type *)((__last - (long)_Var8._M_p) + (long)__result),
                 (thread *)&rfilename,__args_00);
      ptVar4 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)_Var8._M_p,(thread *)__last,__result,
                          (allocator<std::thread> *)&replacementName);
      ptVar4 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)__last,(thread *)__last_00,ptVar4 + 1,
                          (allocator<std::thread> *)&replacementName);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&replacementName,
                 (pointer)_Var8._M_p,
                 (long)(replacementName.field_2._M_allocated_capacity - (long)_Var8._M_p) >> 3);
      replacementName.field_2._M_allocated_capacity = (size_type)(__result + __n);
      replacementName._M_dataplus._M_p = (pointer)__result;
      replacementName._M_string_length = (size_type)ptVar4;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                ((allocator_type *)replacementName._M_string_length,(thread *)&rfilename,__args);
      replacementName._M_string_length = replacementName._M_string_length + 8;
    }
  }
  for (; _Var8._M_p != (pointer)__last; _Var8._M_p = _Var8._M_p + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&replacementName);
  sVar5 = TxaHeader::updateAndCalcBinSize(&header);
  for (pTVar6 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                super__Vector_impl_data._M_start; header.filesize = (uint32_t)sVar5,
      pTVar6 != header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar6 = pTVar6 + 1) {
    uVar9 = header.filesize + 0xf & 0xfffffff0;
    pTVar6->offset = uVar9;
    sVar5 = (size_t)(uVar9 + pTVar6->length);
  }
  TxaHeader::write(&header,(int)output,in,(size_t)pTVar6);
  lVar10 = 8;
  lVar11 = lVar10;
  for (uVar12 = 0;
      uVar12 < (ulong)(((long)chunks.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)chunks.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar12 = uVar12 + 1
      ) {
    std::ostream::seekp((long)output,
                        *(_Ios_Seekdir *)
                         ((long)&(header.chunks.
                                  super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                                  super__Vector_impl_data._M_start)->index + lVar11));
    std::ostream::write((char *)output,
                        *(long *)((long)chunks.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8));
    lVar11 = lVar11 + 0x38;
    lVar10 = lVar10 + 0x18;
  }
  Compressor::~Compressor(&compressor);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&chunks);
  std::vector<Image,_std::allocator<Image>_>::~vector(&images);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::~vector(&header.chunks);
  std::__cxx11::string::~string((string *)&replacementTemplate);
  std::filesystem::__cxx11::path::~path(&replacementDir);
  return 0;
}

Assistant:

int replaceTxa(std::istream &in, std::ostream &output, const fs::path &replacement) {
	fs::path replacementDir = replacement.parent_path();
	std::string replacementTemplate = replacement.stem().string();

	TxaHeader header;
	in >> header;

	std::vector<Image> images(header.chunks.size(), Image());
	std::vector<std::vector<uint8_t>> chunks(header.chunks.size(), std::vector<uint8_t>());
	Compressor compressor;

	bool indexed = true;

	for (size_t i = 0; i < chunks.size(); i++) {
		std::string replacementName = replacementTemplate + "_" + header.chunks[i].name;
		auto rfilename = replacementDir/fs::u8path(replacementName + ".png");

		try {
			images[i] = Image::readPNG(rfilename);
		} catch (std::runtime_error&) {
			fprintf(stderr, "Failed to load replacement %s, not replacing\n", rfilename.string().c_str());
			const auto& chunk = header.chunks[i];
			processChunkNoHeader(images[i], chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, replacementName, header.isSwitch);
		}

		if (!compressor.canPalette(images[i], false)) {
			fprintf(stderr, "%s has too many colors to palette, disabling indexed color for all images\n", replacementName.c_str());
			indexed = false;
		}
	}

	header.indexed = indexed;

	parallel_for(0, chunks.size(), []{ return Compressor(); }, [&](Compressor& c, size_t i) {
		ChunkHeader::Type type = indexed ? ChunkHeader::TYPE_INDEXED : ChunkHeader::TYPE_COLOR;
		if (!c.encodeHeaderlessChunk(chunks[i], images[i], type, header.isSwitch)) {
			throw std::runtime_error("Failed to encode chunk " + std::to_string(i));
		}
		auto& h = header.chunks[i];
		h.decodedLength = indexed ? (1024 + images[i].size.area()) : (4 * images[i].size.area());
		h.width = images[i].size.width;
		h.height = images[i].size.height;
		h.length = chunks[i].size();
	});

	int pos = header.updateAndCalcBinSize();
	for (auto& chunk : header.chunks) {
		pos = align(pos, 16);
		chunk.offset = pos;
		pos += chunk.length;
	}

	header.filesize = pos;
	header.write(output, in);
	for (size_t i = 0; i < chunks.size(); i++) {
		output.seekp(header.chunks[i].offset, output.beg);
		output.write(reinterpret_cast<const char*>(chunks[i].data()), chunks[i].size());
	}
	return 0;
}